

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createTrianglePlane
          (SceneGraph *this,Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  int iVar12;
  TriangleMeshNode *this_00;
  Vec3fa *pVVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  size_t sVar22;
  int iVar23;
  size_t sVar24;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *this_01;
  float fVar25;
  float fVar26;
  Ref<embree::SceneGraph::MaterialNode> local_58;
  Node *local_50;
  ulong local_48;
  Vec3fa *local_40;
  long local_38;
  
  local_50 = (Node *)this;
  this_00 = (TriangleMeshNode *)operator_new(0xd8);
  local_58 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  TriangleMeshNode::TriangleMeshNode(this_00,&local_58,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pvVar3 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar19 = width + 1;
  local_38 = height + 1;
  uVar17 = local_38 * lVar19;
  uVar16 = pvVar3->size_alloced;
  uVar21 = uVar16;
  if ((uVar16 < uVar17) && (uVar21 = uVar17, uVar16 != 0)) {
    while (uVar21 = uVar16, uVar21 < uVar17) {
      uVar16 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0);
    }
  }
  if (uVar17 < pvVar3->size_active) {
    pvVar3->size_active = uVar17;
  }
  if (pvVar3->size_alloced == uVar21) {
    pvVar3->size_active = uVar17;
  }
  else {
    local_40 = pvVar3->items;
    local_48 = uVar21;
    pVVar13 = (Vec3fa *)alignedMalloc(uVar21 << 4,0x10);
    pvVar3->items = pVVar13;
    if (pvVar3->size_active != 0) {
      lVar14 = 0;
      uVar16 = 0;
      do {
        puVar1 = (undefined8 *)((long)&local_40->field_0 + lVar14);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar14);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        uVar16 = uVar16 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar16 < pvVar3->size_active);
    }
    alignedFree(local_40);
    pvVar3->size_active = uVar17;
    pvVar3->size_alloced = local_48;
  }
  this_01 = &this_00->triangles;
  std::
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  ::resize(this_01,width * height * 2);
  lVar14 = 0;
  uVar16 = 0;
  do {
    fVar25 = (float)uVar16 / (float)height;
    uVar21 = 0;
    lVar18 = lVar14;
    do {
      fVar26 = (float)uVar21 / (float)width;
      fVar5 = (dx->field_0).m128[1];
      fVar6 = (dx->field_0).m128[2];
      fVar7 = (p0->field_0).m128[1];
      fVar8 = (p0->field_0).m128[2];
      fVar9 = (dy->field_0).m128[1];
      fVar10 = (dy->field_0).m128[2];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar18) =
           (dy->field_0).m128[0] * fVar25 + fVar26 * (dx->field_0).m128[0] + (p0->field_0).m128[0];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar18 + 4) =
           fVar9 * fVar25 + fVar26 * fVar5 + fVar7;
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar18 + 8) =
           fVar10 * fVar25 + fVar26 * fVar6 + fVar8;
      uVar21 = uVar21 + 1;
      lVar18 = lVar18 + 0x10;
    } while (lVar19 + (ulong)(lVar19 == 0) != uVar21);
    uVar16 = uVar16 + 1;
    lVar14 = lVar14 + width * 0x10 + 0x10;
  } while (uVar16 != local_38 + (ulong)(local_38 == 0));
  if (height != 0) {
    iVar12 = (int)width + 1;
    iVar15 = 1;
    lVar19 = 0;
    sVar22 = 0;
    iVar20 = iVar12;
    do {
      lVar14 = lVar19;
      sVar24 = width;
      iVar4 = iVar20;
      iVar23 = iVar15;
      if (width != 0) {
        do {
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v0 + lVar14) = iVar23 + -1;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v1 + lVar14) = iVar23;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v2 + lVar14) = iVar4;
          *(int *)((long)&(this_01->
                          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                          )._M_impl.super__Vector_impl_data._M_start[1].v0 + lVar14) = iVar4 + 1;
          *(int *)((long)&(this_01->
                          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                          )._M_impl.super__Vector_impl_data._M_start[1].v1 + lVar14) = iVar4;
          *(int *)((long)&(this_01->
                          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                          )._M_impl.super__Vector_impl_data._M_start[1].v2 + lVar14) = iVar23;
          iVar23 = iVar23 + 1;
          lVar14 = lVar14 + 0x18;
          sVar24 = sVar24 - 1;
          iVar4 = iVar4 + 1;
        } while (sVar24 != 0);
      }
      sVar22 = sVar22 + 1;
      iVar20 = iVar20 + iVar12;
      iVar15 = iVar15 + iVar12;
      lVar19 = lVar19 + width * 0x18;
    } while (sVar22 != height);
  }
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_50;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createTrianglePlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->triangles.resize(2*width*height);

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        size_t i = 2*y*width+2*x;
        size_t p00 = (y+0)*(width+1)+(x+0);
        size_t p01 = (y+0)*(width+1)+(x+1);
        size_t p10 = (y+1)*(width+1)+(x+0);
        size_t p11 = (y+1)*(width+1)+(x+1);
        mesh->triangles[i+0].v0 = unsigned(p00); mesh->triangles[i+0].v1 = unsigned(p01); mesh->triangles[i+0].v2 = unsigned(p10);
        mesh->triangles[i+1].v0 = unsigned(p11); mesh->triangles[i+1].v1 = unsigned(p10); mesh->triangles[i+1].v2 = unsigned(p01);
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }